

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_module_declaration
                    (gravity_parser_t *parser,gtoken_t access_specifier,gtoken_t storage_specifier)

{
  gravity_lexer_t *lexer_00;
  size_t sVar1;
  _Bool _Var2;
  _Bool _Var3;
  gtoken_t token_00;
  gnode_r *pgVar4;
  gnode_t *pgVar5;
  gnode_t **ppgVar6;
  size_t local_80;
  gnode_t *decl;
  gnode_t *node;
  gnode_r *declarations;
  _Bool curly_brace;
  char *identifier;
  gtoken_s token;
  gtoken_t type;
  gravity_lexer_t *lexer;
  gtoken_t storage_specifier_local;
  gtoken_t access_specifier_local;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  token.value._4_4_ = gravity_lexer_next(lexer_00);
  gravity_lexer_token((gtoken_s *)&identifier,lexer_00);
  if (token.value._4_4_ != TOK_KEY_MODULE) {
    __assert_fail("type == TOK_KEY_MODULE",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                  ,0x641,"gnode_t *parse_module_declaration(gravity_parser_t *, gtoken_t, gtoken_t)"
                 );
  }
  parse_identifier(parser);
  _Var2 = parse_optional(parser,TOK_OP_OPEN_CURLYBRACE);
  pgVar4 = gnode_array_create();
  while( true ) {
    token_00 = gravity_lexer_peek(lexer_00);
    _Var3 = token_isdeclaration_statement(token_00);
    if (!_Var3) break;
    pgVar5 = parse_declaration_statement(parser);
    if (pgVar5 != (gnode_t *)0x0) {
      if (pgVar4->n == pgVar4->m) {
        if (pgVar4->m == 0) {
          local_80 = 8;
        }
        else {
          local_80 = pgVar4->m << 1;
        }
        pgVar4->m = local_80;
        ppgVar6 = (gnode_t **)realloc(pgVar4->p,pgVar4->m << 3);
        pgVar4->p = ppgVar6;
      }
      sVar1 = pgVar4->n;
      pgVar4->n = sVar1 + 1;
      pgVar4->p[sVar1] = pgVar5;
    }
  }
  if (_Var2) {
    parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
  }
  parse_semicolon(parser);
  report_error(parser,GRAVITY_ERROR_SYNTAX,0x175d21);
  return (gnode_t *)0x0;
}

Assistant:

static gnode_t *parse_module_declaration (gravity_parser_t *parser, gtoken_t access_specifier, gtoken_t storage_specifier) {
    DEBUG_PARSER("parse_module_declaration");

    // module parsed but not yet supported
    // 'module' IDENTIFIER '{' declaration_statement* '}' ';'

    // optional scope already consumed
    DECLARE_LEXER;
    gtoken_t type = gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);
    assert(type == TOK_KEY_MODULE);

    // parse IDENTIFIER
    const char *identifier = parse_identifier(parser);
    DEBUG_PARSER("parse_module_declaration %s", identifier);
    #pragma unused(identifier)

    // parse optional curly brace
    bool curly_brace = parse_optional(parser, TOK_OP_OPEN_CURLYBRACE);

    // create array of declarations nodes
    gnode_r *declarations = gnode_array_create();

    // create module node
    gnode_t *node = NULL;//gnode_module_decl_create(token, identifier, access_specifier, storage_specifier, declarations, meta, LAST_DECLARATION());
    #pragma unused(access_specifier,storage_specifier)

    while (token_isdeclaration_statement(gravity_lexer_peek(lexer))) {
        gnode_t *decl = parse_declaration_statement(parser);
        if (decl) gnode_array_push(declarations, decl);
    }

    // check and consume TOK_OP_CLOSED_CURLYBRACE
    if (curly_brace) parse_required(parser, TOK_OP_CLOSED_CURLYBRACE);

    parse_semicolon(parser);

    REPORT_ERROR(token, "Module declarations not yet supported.");
    return node;
}